

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

InterfaceHandle __thiscall
helics::CommonCore::registerEndpoint
          (CommonCore *this,LocalFederateId federateID,string_view name,string_view type)

{
  string_view name_00;
  string_view string1;
  string_view key;
  string_view type_00;
  string_view units;
  string_view units_00;
  string_view key_00;
  uint16_t uVar1;
  InterfaceHandle IVar2;
  ActionMessage *val;
  char *in_RCX;
  size_t in_RDX;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *in_RDI;
  size_t in_R8;
  CommonCore *in_R9;
  __sv_type _Var3;
  ActionMessage reg;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *handle;
  FederateState *fed;
  InterfaceHandle hid;
  atomic<helics::GlobalFederateId> *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  CommonCore *this_00;
  FederateState *in_stack_fffffffffffffdd8;
  FederateState *this_01;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  action_t in_stack_fffffffffffffdec;
  ActionMessage *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe00;
  InterfaceType HandleType;
  CommonCore *in_stack_fffffffffffffe08;
  LocalFederateId in_stack_fffffffffffffe20;
  undefined2 in_stack_fffffffffffffe24;
  GlobalFederateId global_federateId;
  size_t in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  uint16_t in_stack_fffffffffffffe50;
  uint16_t in_stack_fffffffffffffec4;
  InterfaceType in_stack_fffffffffffffec7;
  FederateState *in_stack_fffffffffffffec8;
  string_view in_stack_fffffffffffffed0;
  InterfaceHandle in_stack_fffffffffffffee4;
  string_view in_stack_fffffffffffffef0;
  size_t in_stack_ffffffffffffff00;
  char *pcStack_f0;
  char local_b8 [32];
  __sv_type local_98;
  CommonCore *pCStack_80;
  BaseType local_68;
  BaseType local_64;
  ActionMessage *local_60;
  FederateState *local_38;
  LocalFederateId in_stack_fffffffffffffffc;
  
  HandleType = (InterfaceType)((ulong)in_stack_fffffffffffffe00 >> 0x38);
  key_00._M_str = in_RCX;
  key_00._M_len = in_RDX;
  local_38 = checkNewInterface(in_R9,in_stack_fffffffffffffffc,key_00,(InterfaceType)(in_R8 >> 0x38)
                              );
  pCStack_80 = in_R9;
  local_64 = (BaseType)std::atomic::operator_cast_to_GlobalFederateId(in_stack_fffffffffffffdc8);
  local_68 = (local_38->local_id).fid;
  pcVar4 = local_b8;
  this_00 = pCStack_80;
  std::__cxx11::string::string(in_stack_fffffffffffffde0);
  local_98 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdd0);
  uVar1 = FederateState::getInterfaceFlags(in_stack_fffffffffffffdd8);
  global_federateId.gid._2_2_ = uVar1;
  global_federateId.gid._0_2_ = in_stack_fffffffffffffe24;
  key._M_str = pcVar4;
  key._M_len = (size_t)in_RDI;
  type_00._M_str = in_stack_fffffffffffffe38;
  type_00._M_len = in_stack_fffffffffffffe30;
  units._M_str._0_4_ = in_stack_fffffffffffffe48;
  units._M_len = in_stack_fffffffffffffe40;
  units._M_str._4_4_ = in_stack_fffffffffffffe4c;
  this_01 = (FederateState *)local_98._M_len;
  val = (ActionMessage *)
        createBasicHandle(in_stack_fffffffffffffe08,global_federateId,in_stack_fffffffffffffe20,
                          HandleType,key,type_00,units,in_stack_fffffffffffffe50);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCStack_80);
  local_60 = val;
  IVar2 = BasicHandleInfo::getInterfaceHandle((BasicHandleInfo *)val);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCStack_80
                    );
  pcVar4 = (char *)_Var3._M_len;
  pcStack_f0 = _Var3._M_str;
  FederateState::getInterfaceFlags(this_01);
  units_00._M_str = pcVar4;
  units_00._M_len = in_stack_ffffffffffffff00;
  FederateState::createInterface
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec7,in_stack_fffffffffffffee4,
             in_stack_fffffffffffffed0,in_stack_fffffffffffffef0,units_00,in_stack_fffffffffffffec4)
  ;
  ActionMessage::ActionMessage(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  std::atomic<helics::GlobalFederateId>::load(&local_38->global_id,seq_cst);
  name_00._M_str = (char *)this_00;
  name_00._M_len = in_R8;
  ActionMessage::name((ActionMessage *)0x46b4f5,name_00);
  string1._M_str = pcStack_f0;
  string1._M_len = (size_t)pcVar4;
  ActionMessage::setStringData((ActionMessage *)this_00,string1);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(in_RDI,val);
  ActionMessage::~ActionMessage((ActionMessage *)this_00);
  return (InterfaceHandle)IVar2.hid;
}

Assistant:

InterfaceHandle CommonCore::registerEndpoint(LocalFederateId federateID,
                                             std::string_view name,
                                             std::string_view type)
{
    auto* fed = checkNewInterface(federateID, name, InterfaceType::ENDPOINT);
    const auto& handle = createBasicHandle(fed->global_id,
                                           fed->local_id,
                                           InterfaceType::ENDPOINT,
                                           name,
                                           type,
                                           std::string{},
                                           fed->getInterfaceFlags());

    auto hid = handle.getInterfaceHandle();
    fed->createInterface(
        InterfaceType::ENDPOINT, hid, name, type, gEmptyString, fed->getInterfaceFlags());
    ActionMessage reg(CMD_REG_ENDPOINT);
    reg.source_id = fed->global_id.load();
    reg.source_handle = hid;
    reg.name(name);
    reg.setStringData(type);
    reg.flags = handle.flags;
    actionQueue.push(std::move(reg));

    return hid;
}